

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::CoreMLModels::Gazetteer::Clear(Gazetteer *this)

{
  string *psVar1;
  
  psVar1 = (this->language_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  this->revision_ = 0;
  if ((this->_oneof_case_[0] == 200) &&
     ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
    (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Gazetteer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CoreMLModels.Gazetteer)
  language_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  modelparameterdata_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  revision_ = 0u;
  clear_ClassLabels();
}